

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_private.c
# Opt level: O0

zt_log_ty * zt_log_new(zt_log_vtbl_ty *vptr,uint opts)

{
  zt_log_ty *pzVar1;
  uint in_ESI;
  zt_log_vtbl_ty *in_RDI;
  zt_log_ty *result;
  size_t in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  pzVar1 = (zt_log_ty *)
           zt_calloc_p(CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  if (pzVar1 == (zt_log_ty *)0x0) {
    fprintf(_stderr,"Unable to calloc memory for log vtable\n");
    exit(1);
  }
  pzVar1->vtbl = in_RDI;
  pzVar1->opts = in_ESI;
  pzVar1->level = zt_log_max;
  return pzVar1;
}

Assistant:

zt_log_ty *
zt_log_new(zt_log_vtbl_ty * vptr, unsigned int opts) {
    zt_log_ty * result;

    result        = zt_callocs(vptr->size, 1);
    if (!result) {
        fprintf(stderr, "Unable to calloc memory for log vtable\n");
        exit(1);
    }
    result->vtbl  = vptr;
    result->opts  = opts;
    result->level = zt_log_max;

    return result;
}